

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putRGBUAseparate8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  byte bVar1;
  uint8_t *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  lVar3 = (long)fromskew;
  while (bVar6 = h != 0, h = h - 1, bVar6) {
    lVar4 = (long)toskew * -4;
    for (lVar5 = 0; w != (uint32_t)lVar5; lVar5 = lVar5 + 1) {
      bVar1 = a[lVar5];
      puVar2 = img->UaToAa;
      cp[lVar5] = (uint)bVar1 << 0x18 | (uint)puVar2[(ulong)r[lVar5] + (ulong)bVar1 * 0x100] |
                  (uint)puVar2[(ulong)g[lVar5] + (ulong)bVar1 * 0x100] << 8 |
                  (uint)puVar2[(ulong)b[lVar5] + (ulong)bVar1 * 0x100] << 0x10;
      lVar4 = lVar4 + -4;
    }
    r = r + lVar5 + lVar3;
    g = g + lVar5 + lVar3;
    b = b + lVar5 + lVar3;
    a = a + lVar5 + lVar3;
    cp = (uint32_t *)((long)cp - lVar4);
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBUAseparate8bittile)
{
    (void)img;
    (void)y;
    for (; h > 0; --h)
    {
        uint32_t rv, gv, bv, av;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            av = *a++;
            m = img->UaToAa + ((size_t)av << 8);
            rv = m[*r++];
            gv = m[*g++];
            bv = m[*b++];
            *cp++ = PACK4(rv, gv, bv, av);
        }
        SKEW4(r, g, b, a, fromskew);
        cp += toskew;
    }
}